

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall
HighsLp::userBoundScaleOk(HighsLp *this,HighsInt user_bound_scale,double infinite_bound)

{
  bool bVar1;
  int bound_scale;
  int in_ESI;
  double in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  HighsInt dl_user_bound_scale;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  bound_scale = in_ESI - *(int *)((long)in_RDI + 0x200);
  if (bound_scale == 0) {
    local_1 = true;
  }
  else {
    bVar1 = boundScaleOk((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_XMM0_Qa,bound_scale,in_RDI);
    if (bVar1) {
      local_1 = boundScaleOk((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_XMM0_Qa,bound_scale,
                             in_RDI);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool HighsLp::userBoundScaleOk(const HighsInt user_bound_scale,
                               const double infinite_bound) const {
  const HighsInt dl_user_bound_scale =
      user_bound_scale - this->user_bound_scale_;
  if (!dl_user_bound_scale) return true;
  if (!boundScaleOk(this->col_lower_, this->col_upper_, dl_user_bound_scale,
                    infinite_bound))
    return false;
  return boundScaleOk(this->row_lower_, this->row_upper_, dl_user_bound_scale,
                      infinite_bound);
}